

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O0

void __thiscall duckdb::CreateViewInfo::Serialize(CreateViewInfo *this,Serializer *serializer)

{
  vector<duckdb::Value,_true> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Serializer *in_stack_000000d8;
  CreateInfo *in_stack_000000e0;
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  field_id_t field_id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *value;
  Serializer *in_stack_ffffffffffffffc0;
  char *tag;
  field_id_t in_stack_ffffffffffffffce;
  Serializer *in_stack_ffffffffffffffd0;
  char local_28 [24];
  vector<duckdb::Value,_true> *local_10;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30);
  local_10 = in_RSI;
  CreateInfo::Serialize(in_stack_000000e0,in_stack_000000d8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffc0,field_id,in_stack_ffffffffffffffb0,in_RDI);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_ffffffffffffffc0,field_id,in_stack_ffffffffffffffb0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_RDI);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (in_stack_ffffffffffffffc0,field_id,in_stack_ffffffffffffffb0,
             (vector<duckdb::LogicalType,_true> *)in_RDI);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
            (in_stack_ffffffffffffffc0,field_id,in_stack_ffffffffffffffb0,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)in_RDI);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_ffffffffffffffc0,field_id,in_stack_ffffffffffffffb0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_RDI);
  value = &in_RDI[0xc].field_2;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  tag = local_28;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0xace7ef);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,tag,
             (vector<duckdb::Value,_true> *)value,local_10);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xace81b);
  return;
}

Assistant:

void CreateViewInfo::Serialize(Serializer &serializer) const {
	CreateInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "view_name", view_name);
	serializer.WritePropertyWithDefault<vector<string>>(201, "aliases", aliases);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(202, "types", types);
	serializer.WritePropertyWithDefault<unique_ptr<SelectStatement>>(203, "query", query);
	serializer.WritePropertyWithDefault<vector<string>>(204, "names", names);
	serializer.WritePropertyWithDefault<vector<Value>>(205, "column_comments", column_comments, vector<Value>());
}